

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeTabBar(ImGuiTabBar *tab_bar,char *label)

{
  ImVector<unsigned_int> *pIVar1;
  ImGuiTabItem *tab;
  float fVar2;
  int iVar3;
  uint uVar4;
  ImGuiTabItem *pIVar5;
  ImGuiWindow *pIVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  ImDrawList *this;
  char *pcVar12;
  undefined8 uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  char buf [256];
  ImVec2 local_148;
  ImVec2 local_140;
  char local_138 [256];
  undefined1 local_38 [8];
  
  iVar3 = tab_bar->PrevFrameVisible;
  iVar16 = GImGui->FrameCount + -2;
  pcVar11 = " *Inactive*";
  if (iVar16 <= iVar3) {
    pcVar11 = "";
  }
  iVar9 = ImFormatString(local_138,0x100,"%s 0x%08X (%d tabs)%s",label,(ulong)tab_bar->ID,
                         (ulong)(uint)(tab_bar->Tabs).Size,pcVar11);
  iVar10 = ImFormatString(local_138 + iVar9,0x100 - (long)iVar9,"  { ");
  pcVar11 = local_138 + iVar9 + iVar10;
  if ((tab_bar->Tabs).Size < 1) {
    pcVar12 = " } ";
  }
  else {
    lVar14 = 0;
    lVar17 = 0;
    do {
      pcVar12 = ", ";
      if (lVar14 == 0) {
        pcVar12 = "";
      }
      iVar9 = ImFormatString(pcVar11,(size_t)(local_38 + -(long)pcVar11),"%s\'%s\'",pcVar12);
      pcVar11 = pcVar11 + iVar9;
      lVar17 = lVar17 + 1;
      iVar9 = (tab_bar->Tabs).Size;
      iVar10 = 3;
      if (iVar9 < 3) {
        iVar10 = iVar9;
      }
      lVar14 = lVar14 + 0x2c;
    } while (lVar17 < iVar10);
    pcVar12 = " } ";
    if (3 < iVar9) {
      pcVar12 = " ... }";
    }
  }
  ImFormatString(pcVar11,(size_t)(local_38 + -(long)pcVar11),pcVar12);
  if (iVar3 < iVar16) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
  }
  bVar7 = TreeNode(label,"%s",local_138);
  if (iVar3 < iVar16) {
    PopStyleColor(1);
  }
  else {
    bVar8 = IsItemHovered(0);
    if (bVar8) {
      this = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
      ImDrawList::AddRect(this,&(tab_bar->BarRect).Min,&(tab_bar->BarRect).Max,0xff00ffff,0.0,0,1.0)
      ;
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMinX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMaxX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
    }
  }
  if (bVar7) {
    if (0 < (tab_bar->Tabs).Size) {
      lVar14 = 0;
      uVar15 = 0;
      do {
        pIVar5 = (tab_bar->Tabs).Data;
        tab = (ImGuiTabItem *)((long)&pIVar5->ID + lVar14);
        PushID(tab);
        bVar7 = SmallButton("<");
        if (bVar7) {
          TabBarQueueReorder(tab_bar,tab,-1);
        }
        pIVar6 = GImGui->CurrentWindow;
        if (pIVar6->SkipItems == false) {
          fVar2 = (pIVar6->DC).CursorPosPrevLine.y;
          (pIVar6->DC).CursorPos.x = (pIVar6->DC).CursorPosPrevLine.x + 2.0;
          (pIVar6->DC).CursorPos.y = fVar2;
          (pIVar6->DC).CurrLineSize = (pIVar6->DC).PrevLineSize;
          (pIVar6->DC).CurrLineTextBaseOffset = (pIVar6->DC).PrevLineTextBaseOffset;
          (pIVar6->DC).IsSameLine = true;
        }
        bVar7 = SmallButton(">");
        if (bVar7) {
          TabBarQueueReorder(tab_bar,tab,1);
        }
        pIVar6 = GImGui->CurrentWindow;
        if (pIVar6->SkipItems == false) {
          (pIVar6->DC).CursorPos.x =
               (GImGui->Style).ItemSpacing.x + (pIVar6->DC).CursorPosPrevLine.x;
          (pIVar6->DC).CursorPos.y = (pIVar6->DC).CursorPosPrevLine.y;
          (pIVar6->DC).CurrLineSize = (pIVar6->DC).PrevLineSize;
          (pIVar6->DC).CurrLineTextBaseOffset = (pIVar6->DC).PrevLineTextBaseOffset;
          (pIVar6->DC).IsSameLine = true;
        }
        uVar4 = *(uint *)((long)&pIVar5->ID + lVar14);
        uVar13 = 0x20;
        if (uVar4 == tab_bar->SelectedTabId) {
          uVar13 = 0x2a;
        }
        lVar17 = (long)*(int *)((long)&pIVar5->NameOffset + lVar14);
        pcVar11 = "???";
        if (lVar17 != -1) {
          pcVar11 = (tab_bar->TabsNames).Buf.Data + lVar17;
        }
        Text("%02d%c Tab 0x%08X \'%s\' Offset: %.2f, Width: %.2f/%.2f",
             (double)*(float *)((long)&pIVar5->Offset + lVar14),
             (double)*(float *)((long)&pIVar5->Width + lVar14),
             (double)*(float *)((long)&pIVar5->ContentWidth + lVar14),uVar15 & 0xffffffff,uVar13,
             (ulong)uVar4,pcVar11);
        pIVar1 = &GImGui->CurrentWindow->IDStack;
        pIVar1->Size = pIVar1->Size + -1;
        uVar15 = uVar15 + 1;
        lVar14 = lVar14 + 0x2c;
      } while ((long)uVar15 < (long)(tab_bar->Tabs).Size);
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTabBar(ImGuiTabBar* tab_bar, const char* label)
{
    // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
    char buf[256];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (tab_bar->PrevFrameVisible >= GetFrameCount() - 2);
    p += ImFormatString(p, buf_end - p, "%s 0x%08X (%d tabs)%s", label, tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
    p += ImFormatString(p, buf_end - p, "  { ");
    for (int tab_n = 0; tab_n < ImMin(tab_bar->Tabs.Size, 3); tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        p += ImFormatString(p, buf_end - p, "%s'%s'",
            tab_n > 0 ? ", " : "", (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???");
    }
    p += ImFormatString(p, buf_end - p, (tab_bar->Tabs.Size > 3) ? " ... }" : " } ");
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(label, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (is_active && IsItemHovered())
    {
        ImDrawList* draw_list = GetForegroundDrawList();
        draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
    }
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            PushID(tab);
            if (SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } SameLine(0, 2);
            if (SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } SameLine();
            Text("%02d%c Tab 0x%08X '%s' Offset: %.2f, Width: %.2f/%.2f",
                tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???", tab->Offset, tab->Width, tab->ContentWidth);
            PopID();
        }
        TreePop();
    }
}